

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

HighsInt __thiscall HEkkDualRow::debugChooseColumnInfeasibilities(HEkkDualRow *this)

{
  value_type vVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  const_reference pvVar9;
  long *in_RDI;
  double dVar10;
  double dVar11;
  bool infeasible;
  double infeasibility_after_flip;
  double new_dual;
  double delta_dual;
  double dual;
  HighsInt move;
  double value;
  HighsInt iCol;
  HighsInt i;
  double Td;
  HighsInt ix;
  HighsLp *lp;
  vector<double,_std::allocator<double>_> unpack_value;
  HighsInt num_infeasibility;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  size_type in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  uint local_54;
  int local_48;
  vector<double,_std::allocator<double>_> local_30;
  int local_14;
  int local_4;
  
  local_14 = 0;
  if (*(int *)(*(long *)(*in_RDI + 8) + 0x15c) < 1) {
    local_4 = 0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x7a1c39);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    for (local_48 = 0; local_48 < (int)in_RDI[0xd]; local_48 = local_48 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x11),(long)local_48)
      ;
      vVar1 = *pvVar6;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_48);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,(long)*pvVar7);
      *pvVar8 = vVar1;
    }
    dVar2 = *(double *)(*(long *)(*in_RDI + 8) + 0x120);
    for (local_54 = 0; (int)local_54 < *(int *)((long)in_RDI + 0xc4); local_54 = local_54 + 1) {
      pvVar9 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RDI + 0x19),(long)(int)local_54);
      uVar5 = pvVar9->first;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,(long)(int)uVar5);
      dVar3 = *pvVar8;
      dVar4 = *(double *)(in_RDI[4] + (long)(int)uVar5 * 8);
      dVar10 = -(double)in_RDI[0x17] * dVar3 + dVar4;
      dVar11 = (double)-(int)*(char *)(in_RDI[3] + (long)(int)uVar5) * dVar10;
      in_stack_ffffffffffffff77 = dVar11 < -dVar2;
      if ((bool)in_stack_ffffffffffffff77) {
        printf("%3d: iCol = %4d; dual = %11.4g; value = %11.4g; move = %2d; delta = %11.4g; new_dual = %11.4g; infeasibility = %11.4g: %d\n"
               ,dVar4,SUB84(dVar3,0),ABS((double)in_RDI[0x17] * dVar3),dVar10,dVar11,(ulong)local_54
               ,(ulong)uVar5,(ulong)(uint)(int)*(char *)(in_RDI[3] + (long)(int)uVar5),
               (ulong)(byte)in_stack_ffffffffffffff77);
        local_14 = local_14 + 1;
      }
    }
    local_4 = local_14;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  }
  return local_4;
}

Assistant:

HighsInt HEkkDualRow::debugChooseColumnInfeasibilities() const {
  HighsInt num_infeasibility = 0;
  if (ekk_instance_.options_->highs_debug_level < kHighsDebugLevelCheap)
    return num_infeasibility;
  std::vector<double> unpack_value;
  HighsLp& lp = ekk_instance_.lp_;
  unpack_value.resize(lp.num_col_ + lp.num_row_);
  for (HighsInt ix = 0; ix < packCount; ix++)
    unpack_value[packIndex[ix]] = packValue[ix];
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  for (HighsInt i = 0; i < workCount; i++) {
    const HighsInt iCol = workData[i].first;
    const double value = unpack_value[iCol];
    const HighsInt move = workMove[iCol];
    const double dual = workDual[iCol];
    const double delta_dual = fabs(workTheta * value);
    const double new_dual = dual - workTheta * value;
    const double infeasibility_after_flip = -move * new_dual;
    const bool infeasible = infeasibility_after_flip < -Td;
    if (infeasible) {
      printf(
          "%3d: iCol = %4d; dual = %11.4g; value = %11.4g; move = %2d; delta = "
          "%11.4g; new_dual = %11.4g; infeasibility = %11.4g: %d\n",
          (int)i, (int)iCol, dual, value, (int)move, delta_dual, new_dual,
          infeasibility_after_flip, infeasible);

      num_infeasibility++;
    }
  }
  assert(!num_infeasibility);
  return num_infeasibility;
}